

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

VkImageCreateFlags
vkt::api::anon_unknown_0::getValidImageCreateFlags
          (VkPhysicalDeviceFeatures *deviceFeatures,VkFormat param_2,VkFormatFeatureFlags param_3,
          VkImageType type,VkImageUsageFlags usage)

{
  uint local_24;
  VkImageCreateFlags flags;
  VkImageUsageFlags usage_local;
  VkImageType type_local;
  VkFormatFeatureFlags param_2_local;
  VkFormat param_1_local;
  VkPhysicalDeviceFeatures *deviceFeatures_local;
  
  local_24 = 0;
  if (((usage & 4) != 0) && (local_24 = 8, type == VK_IMAGE_TYPE_2D)) {
    local_24 = 0x18;
  }
  if (((usage & 0xc) != 0) && ((usage & 0x40) == 0)) {
    if (deviceFeatures->sparseBinding != 0) {
      local_24 = local_24 | 3;
    }
    if (deviceFeatures->sparseResidencyAliased != 0) {
      local_24 = local_24 | 4;
    }
  }
  return local_24;
}

Assistant:

VkImageCreateFlags getValidImageCreateFlags (const VkPhysicalDeviceFeatures& deviceFeatures, VkFormat, VkFormatFeatureFlags, VkImageType type, VkImageUsageFlags usage)
{
	VkImageCreateFlags	flags	= (VkImageCreateFlags)0;

	if ((usage & VK_IMAGE_USAGE_SAMPLED_BIT) != 0)
	{
		flags |= VK_IMAGE_CREATE_MUTABLE_FORMAT_BIT;

		if (type == VK_IMAGE_TYPE_2D)
			flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	if ((usage & (VK_IMAGE_USAGE_SAMPLED_BIT|VK_IMAGE_USAGE_STORAGE_BIT)) != 0 &&
		(usage & VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT) == 0)
	{
		if (deviceFeatures.sparseBinding)
			flags |= VK_IMAGE_CREATE_SPARSE_BINDING_BIT|VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT;

		if (deviceFeatures.sparseResidencyAliased)
			flags |= VK_IMAGE_CREATE_SPARSE_ALIASED_BIT;
	}

	return flags;
}